

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::StrEqualityMatcher<std::__cxx11::string>::MatchAndExplain<std::__cxx11::string>
          (StrEqualityMatcher<std::__cxx11::string> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
          MatchResultListener *param_2)

{
  StrEqualityMatcher<std::__cxx11::string> SVar1;
  pointer pcVar2;
  int iVar3;
  StrEqualityMatcher<std::__cxx11::string> SVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar2 = (s->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_38,pcVar2,pcVar2 + s->_M_string_length)
  ;
  if (this[0x21] == (StrEqualityMatcher<std::__cxx11::string>)0x1) {
    if (local_38._M_string_length == *(size_t *)(this + 8)) {
      if (local_38._M_string_length == 0) {
        SVar4 = (StrEqualityMatcher<std::__cxx11::string>)0x1;
      }
      else {
        iVar3 = bcmp(local_38._M_dataplus._M_p,*(void **)this,local_38._M_string_length);
        SVar4 = (StrEqualityMatcher<std::__cxx11::string>)(iVar3 == 0);
      }
    }
    else {
      SVar4 = (StrEqualityMatcher<std::__cxx11::string>)0x0;
    }
  }
  else {
    SVar4 = (StrEqualityMatcher<std::__cxx11::string>)
            CaseInsensitiveStringEquals<std::__cxx11::string>
                      (&local_38,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  }
  SVar1 = this[0x20];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return SVar1 == SVar4;
}

Assistant:

bool MatchAndExplain(const MatcheeStringType& s,
                       MatchResultListener* /* listener */) const {
    const StringType s2(s);
    const bool eq = case_sensitive_ ? s2 == string_
                                    : CaseInsensitiveStringEquals(s2, string_);
    return expect_eq_ == eq;
  }